

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anna_hashmap.h
# Opt level: O2

void __thiscall
anna_hashmap<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::anna_hashmap(anna_hashmap<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  allocator_type local_1a;
  allocator_type local_19;
  
  this->size_ = 0;
  std::
  vector<std::forward_list<std::pair<const_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::vector(&this->table_,10,&local_19);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->bucket_sizes_,10,&local_1a);
  return;
}

Assistant:

anna_hashmap()
        : size_(0),
          table_(DEFAULT_TABLE_SIZE),
          bucket_sizes_(DEFAULT_TABLE_SIZE) {}